

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  char *local_40;
  uLong uncomprLen;
  uLong comprLen;
  Byte *uncompr;
  Byte *compr;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  uncomprLen = 40000;
  compr = (Byte *)argv;
  argv_local._0_4_ = argc;
  pcVar2 = (char *)zlibVersion();
  if (*pcVar2 != *main::myVersion) {
    fprintf(_stderr,"incompatible zlib version\n");
    exit(1);
  }
  pcVar2 = (char *)zlibVersion();
  iVar1 = strcmp(pcVar2,"1.2.11");
  if (iVar1 != 0) {
    fprintf(_stderr,"warning: different zlib version\n");
  }
  uVar3 = zlibCompileFlags();
  printf("zlib version %s = 0x%04x, compile flags = 0x%lx\n","1.2.11",0x12b0,uVar3);
  uncompr = (Byte *)calloc(uncomprLen & 0xffffffff,1);
  comprLen = (uLong)calloc(40000,1);
  if ((uncompr != (Byte *)0x0) && ((Byte *)comprLen != (Byte *)0x0)) {
    test_compress(uncompr,uncomprLen,(Byte *)comprLen,40000);
    if ((int)argv_local < 2) {
      local_40 = "foo.gz";
    }
    else {
      local_40 = *(char **)(compr + 8);
    }
    test_gzio(local_40,(Byte *)comprLen,40000);
    test_deflate(uncompr,uncomprLen);
    test_inflate(uncompr,uncomprLen,(Byte *)comprLen,40000);
    test_large_deflate(uncompr,uncomprLen,(Byte *)comprLen,40000);
    test_large_inflate(uncompr,uncomprLen,(Byte *)comprLen,40000);
    test_flush(uncompr,&uncomprLen);
    test_sync(uncompr,uncomprLen,(Byte *)comprLen,40000);
    uncomprLen = 40000;
    test_dict_deflate(uncompr,40000);
    test_dict_inflate(uncompr,uncomprLen,(Byte *)comprLen,40000);
    free(uncompr);
    free((void *)comprLen);
    return 0;
  }
  printf("out of memory\n");
  exit(1);
}

Assistant:

int main(argc, argv)
    int argc;
    char *argv[];
{
    Byte *compr, *uncompr;
    uLong comprLen = 10000*sizeof(int); /* don't overflow on MSDOS */
    uLong uncomprLen = comprLen;
    static const char* myVersion = ZLIB_VERSION;

    if (zlibVersion()[0] != myVersion[0]) {
        fprintf(stderr, "incompatible zlib version\n");
        exit(1);

    } else if (strcmp(zlibVersion(), ZLIB_VERSION) != 0) {
        fprintf(stderr, "warning: different zlib version\n");
    }

    printf("zlib version %s = 0x%04x, compile flags = 0x%lx\n",
            ZLIB_VERSION, ZLIB_VERNUM, zlibCompileFlags());

    compr    = (Byte*)calloc((uInt)comprLen, 1);
    uncompr  = (Byte*)calloc((uInt)uncomprLen, 1);
    /* compr and uncompr are cleared to avoid reading uninitialized
     * data and to ensure that uncompr compresses well.
     */
    if (compr == Z_NULL || uncompr == Z_NULL) {
        printf("out of memory\n");
        exit(1);
    }

#ifdef Z_SOLO
    (void)argc;
    (void)argv;
#else
    test_compress(compr, comprLen, uncompr, uncomprLen);

    test_gzio((argc > 1 ? argv[1] : TESTFILE),
              uncompr, uncomprLen);
#endif

    test_deflate(compr, comprLen);
    test_inflate(compr, comprLen, uncompr, uncomprLen);

    test_large_deflate(compr, comprLen, uncompr, uncomprLen);
    test_large_inflate(compr, comprLen, uncompr, uncomprLen);

    test_flush(compr, &comprLen);
    test_sync(compr, comprLen, uncompr, uncomprLen);
    comprLen = uncomprLen;

    test_dict_deflate(compr, comprLen);
    test_dict_inflate(compr, comprLen, uncompr, uncomprLen);

    free(compr);
    free(uncompr);

    return 0;
}